

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  ImFontGlyph *pIVar1;
  ImWchar in_SI;
  ImVector<ImFontGlyph> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float in_stack_00000008;
  ImFontGlyph *glyph;
  int in_stack_ffffffffffffffbc;
  
  ImVector<ImFontGlyph>::resize(in_RDI,in_stack_ffffffffffffffbc);
  pIVar1 = ImVector<ImFontGlyph>::back((ImVector<ImFontGlyph> *)&in_RDI[2].Data);
  pIVar1->Codepoint = in_SI;
  pIVar1->X0 = in_XMM0_Da;
  pIVar1->Y0 = in_XMM1_Da;
  pIVar1->X1 = in_XMM2_Da;
  pIVar1->Y1 = in_XMM3_Da;
  pIVar1->U0 = in_XMM4_Da;
  pIVar1->V0 = in_XMM5_Da;
  pIVar1->U1 = in_XMM6_Da;
  pIVar1->V1 = in_XMM7_Da;
  pIVar1->AdvanceX = in_stack_00000008 + *(float *)(*(long *)(in_RDI + 5) + 0x24);
  if ((*(byte *)(*(long *)(in_RDI + 5) + 0x20) & 1) != 0) {
    pIVar1->AdvanceX = (float)(int)(pIVar1->AdvanceX + 0.5);
  }
  *(undefined1 *)&in_RDI[7].Size = 1;
  *(int *)((long)&in_RDI[6].Data + 4) =
       (int)((pIVar1->U1 - pIVar1->U0) * (float)*(int *)(in_RDI[4].Data + 1) + 1.99) *
       (int)((pIVar1->V1 - pIVar1->V0) * (float)(int)in_RDI[4].Data[1].AdvanceX + 1.99) +
       *(int *)((long)&in_RDI[6].Data + 4);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (ImWchar)codepoint;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = IM_ROUND(glyph.AdvanceX);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}